

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack30_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x3fffffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1e;
  *puVar1 = (in[1] & 0xfffffff) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1c;
  *puVar1 = (in[2] & 0x3ffffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x1a;
  *puVar1 = (in[3] & 0xffffff) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x18;
  *puVar1 = (in[4] & 0x3fffff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x16;
  *puVar1 = (in[5] & 0xfffff) << 10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0x14;
  *puVar1 = (in[6] & 0x3ffff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0x12;
  *puVar1 = (in[7] & 0xffff) << 0xe | *puVar1;
  *puVar1 = base + *puVar1;
  return in + 8;
}

Assistant:

uint32_t * unpack30_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 30 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 30 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 30 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 30 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 30 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 30 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 30 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 30 - 16 );
    *out += base;
    out++;

    return in + 1;
}